

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O1

string * __thiscall
slang::ast::GenerateBlockArraySymbol::getExternalName_abi_cxx11_
          (string *__return_storage_ptr__,GenerateBlockArraySymbol *this)

{
  size_t sVar1;
  char *pcVar2;
  Scope *pSVar3;
  Scope *in_RCX;
  
  sVar1 = (this->super_Symbol).name._M_len;
  if (sVar1 == 0) {
    pSVar3 = (this->super_Symbol).parentScope;
    if (pSVar3 == (Scope *)0x0) {
      assert::assertFailed
                ("parent",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/BlockSymbols.cpp"
                 ,0x2e2,"std::string slang::ast::GenerateBlockArraySymbol::getExternalName() const")
      ;
    }
    createGenBlkName_abi_cxx11_
              (__return_storage_ptr__,(ast *)(ulong)this->constructIndex,(uint32_t)pSVar3,in_RCX);
  }
  else {
    pcVar2 = (this->super_Symbol).name._M_str;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateBlockArraySymbol::getExternalName() const {
    if (!name.empty())
        return std::string(name);

    auto parent = getParentScope();
    ASSERT(parent);

    return createGenBlkName(constructIndex, *parent);
}